

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O2

void __thiscall QPainter::eraseRect(QPainter *this,QRect *rect)

{
  long in_FS_OFFSET;
  QRectF QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QRectF::QRectF(&QStack_38,rect);
  QPainter::eraseRect((QRectF *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::eraseRect(const QRect &rect)
{
    eraseRect(QRectF(rect));
}